

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * Lib::StringUtils::sanitizeSuffix(string *__return_storage_ptr__,string *str)

{
  size_t s;
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  
  s = str->_M_string_length;
  if (sanitizeSuffix(std::__cxx11::string)::buf == '\0') {
    iVar4 = __cxa_guard_acquire(&sanitizeSuffix(std::__cxx11::string)::buf);
    if (iVar4 != 0) {
      sanitizeSuffix::buf._size = 0;
      sanitizeSuffix::buf._capacity = 0;
      sanitizeSuffix::buf._array = (char *)0x0;
      __cxa_atexit(DArray<char>::~DArray,&sanitizeSuffix::buf,&__dso_handle);
      __cxa_guard_release(&sanitizeSuffix(std::__cxx11::string)::buf);
    }
  }
  DArray<char>::ensure(&sanitizeSuffix::buf,s);
  pcVar2 = sanitizeSuffix::buf._array;
  pcVar1 = (str->_M_dataplus)._M_p;
  lVar5 = 0;
  do {
    pcVar3 = sanitizeSuffix::buf._array;
    bVar6 = pcVar1[lVar5];
    uVar7 = (ulong)bVar6;
    if (uVar7 < 0x2f) {
      if ((0x53b400000000U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,pcVar3,pcVar3 + s);
          return __return_storage_ptr__;
        }
      }
      else {
        bVar6 = 0x5f;
      }
    }
    pcVar2[lVar5] = bVar6;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

std::string StringUtils::sanitizeSuffix(std::string str)
{
  size_t len=str.size();
  static DArray<char> buf;
  buf.ensure(len);

  const char* sptr=str.c_str();
  char* tptr=buf.array();

  while(*sptr) {
    char c = *sptr;

    switch(c) {
    case '(':
    case ')':
    case '"':
    case '\'':
    case '$':
    case '%':
    case ',':
    case '.':
      c = '_';
      break;
    default: break;
    }

    *tptr = c;
    tptr++;
    sptr++;
  }
  return std::string(buf.array(), len);
}